

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# abciUnfold2.c
# Opt level: O1

int Abc_CommandUnfold2(Abc_Frame_t *pAbc,int argc,char **argv)

{
  int iVar1;
  uint uVar2;
  uint nProps;
  Abc_Ntk_t *pAVar3;
  char *pcVar4;
  int iVar5;
  uint fVerbose;
  uint local_44;
  
  pAVar3 = Abc_FrameReadNtk(pAbc);
  fVerbose = 0;
  Extra_UtilGetoptReset();
  nProps = 1000;
  local_44 = 1000;
  do {
    while (iVar1 = Extra_UtilGetopt(argc,argv,"CPvh"), iVar5 = globalUtilOptind, iVar1 == 0x76) {
      fVerbose = fVerbose ^ 1;
    }
    if (iVar1 == -1) {
      if (pAVar3 != (Abc_Ntk_t *)0x0) {
        if (pAVar3->nObjCounts[8] == 0) {
          pcVar4 = "The network is combinational.\n";
        }
        else if (pAVar3->ntkType == ABC_NTK_STRASH) {
          if (pAVar3->nConstrs < 1) {
            if (pAVar3->vPos->nSize < 2) {
              pAVar3 = Abc_NtkDarUnfold2(pAVar3,1,local_44,nProps,0,0,fVerbose);
              if (pAVar3 != (Abc_Ntk_t *)0x0) {
                Abc_FrameReplaceCurrentNetwork(pAbc,pAVar3);
                return 0;
              }
              pcVar4 = "Transformation has failed.\n";
              iVar5 = 1;
              goto LAB_002715d3;
            }
            pcVar4 = 
            "Functional constraint extraction works for single-output miters (use \"orpos\").\n";
          }
          else {
            pcVar4 = "Constraints are already extracted.\n";
          }
        }
        else {
          pcVar4 = "Currently only works for structurally hashed circuits.\n";
        }
        iVar5 = -1;
LAB_002715d3:
        Abc_Print(iVar5,pcVar4);
        return 0;
      }
      pcVar4 = "Empty network.\n";
      iVar5 = -1;
      goto LAB_002716d0;
    }
    if (iVar1 == 0x50) {
      if (argc <= globalUtilOptind) {
        pcVar4 = "Command line switch \"-P\" should be followed by an integer.\n";
        goto LAB_0027163a;
      }
      nProps = atoi(argv[globalUtilOptind]);
      uVar2 = nProps;
    }
    else {
      if (iVar1 != 0x43) goto LAB_0027164a;
      if (argc <= globalUtilOptind) {
        pcVar4 = "Command line switch \"-C\" should be followed by an integer.\n";
LAB_0027163a:
        Abc_Print(-1,pcVar4);
        goto LAB_0027164a;
      }
      local_44 = atoi(argv[globalUtilOptind]);
      uVar2 = local_44;
    }
    globalUtilOptind = iVar5 + 1;
    if ((int)uVar2 < 0) {
LAB_0027164a:
      Abc_Print(-2,"usage: unfold2 [-FCP num] [-savh]\n");
      Abc_Print(-2,"\t         unfold hidden constraints as separate outputs\n");
      Abc_Print(-2,"\t-C num : the max number of conflicts in SAT solving [default = %d]\n",
                (ulong)local_44);
      Abc_Print(-2,"\t-P num : the max number of constraint propagations [default = %d]\n",
                (ulong)nProps);
      pcVar4 = "yes";
      if (fVerbose == 0) {
        pcVar4 = "no";
      }
      Abc_Print(-2,"\t-v     : toggle printing verbose information [default = %s]\n",pcVar4);
      pcVar4 = "\t-h     : print the command usage\n";
      iVar5 = -2;
LAB_002716d0:
      Abc_Print(iVar5,pcVar4);
      return 1;
    }
  } while( true );
}

Assistant:

int Abc_CommandUnfold2( Abc_Frame_t * pAbc, int argc, char ** argv )
{
    Abc_Ntk_t * pNtk, * pNtkRes;
    int nFrames;
    int nConfs;
    int nProps;
    int fStruct = 0;
    int fOldAlgo = 0;
    int fVerbose;
    int c;
    extern Abc_Ntk_t * Abc_NtkDarUnfold2( Abc_Ntk_t * pNtk, int nFrames, int nConfs, int nProps, int fStruct, int fOldAlgo, int fVerbose );
    pNtk = Abc_FrameReadNtk(pAbc);
    // set defaults
    nFrames   =      1;
    nConfs    =   1000;
    nProps    =   1000;
    fVerbose  =      0;
    Extra_UtilGetoptReset();
    while ( ( c = Extra_UtilGetopt( argc, argv, "CPvh" ) ) != EOF )
    {
        switch ( c )
        {
        /* case 'F': */
        /*     if ( globalUtilOptind >= argc ) */
        /*     { */
        /*         Abc_Print( -1, "Command line switch \"-F\" should be followed by an integer.\n" ); */
        /*         goto usage; */
        /*     } */
        /*     nFrames = atoi(argv[globalUtilOptind]); */
        /*     globalUtilOptind++; */
        /*     if ( nFrames < 0 ) */
        /*         goto usage; */
        /*     break; */
        case 'C':
            if ( globalUtilOptind >= argc )
            {
                Abc_Print( -1, "Command line switch \"-C\" should be followed by an integer.\n" );
                goto usage;
            }
            nConfs = atoi(argv[globalUtilOptind]);
            globalUtilOptind++;
            if ( nConfs < 0 )
                goto usage;
            break;
        case 'P':
            if ( globalUtilOptind >= argc )
            {
                Abc_Print( -1, "Command line switch \"-P\" should be followed by an integer.\n" );
                goto usage;
            }
            nProps = atoi(argv[globalUtilOptind]);
            globalUtilOptind++;
            if ( nProps < 0 )
                goto usage;
            break;
        case 'v':
            fVerbose ^= 1;
            break;
        case 'h':
            goto usage;
        default:
            goto usage;
        }
    }
    if ( pNtk == NULL )
    {
        Abc_Print( -1, "Empty network.\n" );
        return 1;
    }
    if ( Abc_NtkIsComb(pNtk) )
    {
        Abc_Print( -1, "The network is combinational.\n" );
        return 0;
    }
    if ( !Abc_NtkIsStrash(pNtk) )
    {
        Abc_Print( -1, "Currently only works for structurally hashed circuits.\n" );
        return 0;
    }
    if ( Abc_NtkConstrNum(pNtk) > 0 )
    {
        Abc_Print( -1, "Constraints are already extracted.\n" );
        return 0;
    }
    if ( Abc_NtkPoNum(pNtk) > 1 && !fStruct )
    {
        Abc_Print( -1, "Functional constraint extraction works for single-output miters (use \"orpos\").\n" );
        return 0;
    }
    // modify the current network
    pNtkRes = Abc_NtkDarUnfold2( pNtk, nFrames, nConfs, nProps, fStruct, fOldAlgo, fVerbose );
    if ( pNtkRes == NULL )
    {
        Abc_Print( 1,"Transformation has failed.\n" );
        return 0;
    }
    // replace the current network
    Abc_FrameReplaceCurrentNetwork( pAbc, pNtkRes );
    return 0;
usage:
    Abc_Print( -2, "usage: unfold2 [-FCP num] [-savh]\n" );
    Abc_Print( -2, "\t         unfold hidden constraints as separate outputs\n" );
    Abc_Print( -2, "\t-C num : the max number of conflicts in SAT solving [default = %d]\n", nConfs );
    Abc_Print( -2, "\t-P num : the max number of constraint propagations [default = %d]\n", nProps );
    Abc_Print( -2, "\t-v     : toggle printing verbose information [default = %s]\n", fVerbose? "yes": "no" );
    Abc_Print( -2, "\t-h     : print the command usage\n");
    return 1;
}